

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

Instr * __thiscall LowererMD::Simd128LowerShuffle_4(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *dstOpnd;
  Type pOVar2;
  Instr *pIVar3;
  code *pcVar4;
  Opnd *pOVar5;
  uint8 i_1;
  OpndKind OVar6;
  int32 iVar7;
  int32 iVar8;
  int32 iVar9;
  int32 iVar10;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type *ppOVar11;
  undefined4 *puVar12;
  RegOpnd *pRVar13;
  RegOpnd *dst;
  RegOpnd *dstOpnd_00;
  intptr_t pMemLoc;
  MemRefOpnd *src1Opnd;
  Instr *pIVar14;
  RegOpnd *dst_00;
  uint8 j2;
  byte bVar15;
  byte *lanes_00;
  char *this_01;
  uint8 j1;
  byte bVar16;
  Opnd *src1;
  uint8 i;
  ulong uVar17;
  Instr *instr_00;
  long lVar18;
  bool bVar19;
  Opnd *pOStack_a8;
  Opnd *srcs [6];
  uint8 local_68 [4];
  uint local_64;
  uint8 lanesSrc [4];
  uint fromSrc2;
  byte local_54 [4];
  byte local_50 [4];
  uint8 ordLanes [4];
  uint8 reArrLanes [4];
  uint fromSrc1;
  byte local_34 [8];
  uint8 lanes [4];
  
  OVar1 = instr->m_opcode;
  this_00 = Simd128GetExtendedArgs(this,instr);
  ppOVar11 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                       (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  dstOpnd = *ppOVar11;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  srcs[3] = (Opnd *)0x0;
  srcs[4] = (Opnd *)0x0;
  srcs[1] = (Opnd *)0x0;
  srcs[2] = (Opnd *)0x0;
  pOStack_a8 = (Opnd *)0x0;
  srcs[0] = (Opnd *)0x0;
  if ((SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this_00) {
    uVar17 = 0;
    do {
      ppOVar11 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>
                           );
      pOVar2 = *ppOVar11;
      SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
                 this_00->allocator);
      srcs[uVar17 - 1] = pOVar2;
      if ((SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
          (this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) break;
      bVar19 = uVar17 < 5;
      uVar17 = uVar17 + 1;
    } while (bVar19);
  }
  pIVar3 = instr->m_prev;
  IRType_IsSimd128(dstOpnd->m_type);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar12 = 1;
  bVar19 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                      ,0x61f,
                      "(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128())"
                      ,
                      "dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128()"
                     );
  if (!bVar19) {
LAB_00671924:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar12 = 0;
  if (((OVar1 != Simd128_Shuffle_I4) && (OVar1 != Simd128_Shuffle_F4)) &&
     (OVar1 != Simd128_Shuffle_U4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x620,
                        "(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4)"
                        ,
                        "irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4"
                       );
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  pOVar5 = srcs[1];
  srcs[5] = pOStack_a8;
  if (((srcs[1] == (Opnd *)0x0) ||
      (OVar6 = IR::Opnd::GetKind(srcs[1]), srcs[2] == (Opnd *)0x0 || OVar6 != OpndKindIntConst)) ||
     ((OVar6 = IR::Opnd::GetKind(srcs[2]), srcs[3] == (Opnd *)0x0 || OVar6 != OpndKindIntConst ||
      ((OVar6 = IR::Opnd::GetKind(srcs[3]), srcs[4] == (Opnd *)0x0 || OVar6 != OpndKindIntConst ||
       (OVar6 = IR::Opnd::GetKind(srcs[4]), OVar6 != OpndKindIntConst)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x626,
                        "(srcs[2] && srcs[2]->IsIntConstOpnd() && srcs[3] && srcs[3]->IsIntConstOpnd() && srcs[4] && srcs[4]->IsIntConstOpnd() && srcs[5] && srcs[5]->IsIntConstOpnd())"
                        ,"Type-specialized shuffle is supported only with constant lane indices");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar5);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  iVar7 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar5);
  pOVar5 = srcs[2];
  local_34[0] = (byte)iVar7;
  OVar6 = IR::Opnd::GetKind(srcs[2]);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  _lanesSrc = instr;
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar5);
  pOVar5 = srcs[3];
  local_34[1] = (byte)iVar8;
  OVar6 = IR::Opnd::GetKind(srcs[3]);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  iVar9 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar5);
  this_01 = (char *)srcs[4];
  local_34[2] = (byte)iVar9;
  OVar6 = IR::Opnd::GetKind(srcs[4]);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  iVar10 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)this_01);
  dst_00 = (RegOpnd *)srcs[5];
  bVar15 = (byte)iVar10;
  local_34[3] = bVar15;
  if (7 < (byte)iVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62c,"(lanes[0] >= 0 && lanes[0] < 8)","lanes[0] >= 0 && lanes[0] < 8");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  if (7 < (byte)iVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62d,"(lanes[1] >= 0 && lanes[1] < 8)","lanes[1] >= 0 && lanes[1] < 8");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  if (7 < (byte)iVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62e,"(lanes[2] >= 0 && lanes[2] < 8)","lanes[2] >= 0 && lanes[2] < 8");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  instr_00 = _lanesSrc;
  if (7 < bVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62f,"(lanes[3] >= 0 && lanes[3] < 8)","lanes[3] >= 0 && lanes[3] < 8");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  CheckShuffleLanes_4((LowererMD *)this_01,local_34,local_68,(uint *)ordLanes,&local_64);
  if (local_64 + (int)ordLanes != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar19 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x632,"(fromSrc1 + fromSrc2 == 4)","fromSrc1 + fromSrc2 == 4");
    if (!bVar19) goto LAB_00671924;
    *puVar12 = 0;
  }
  if (local_64 == 4 || ordLanes == (uint8  [4])0x4) {
    if (ordLanes != (uint8  [4])0x4) {
      dst_00 = (RegOpnd *)srcs[0];
    }
    lanes_00 = local_34;
    pRVar13 = dst_00;
  }
  else {
    if (ordLanes != (uint8  [4])0x2) {
      if (local_64 == 3 || ordLanes == (uint8  [4])0x3) {
        pRVar13 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        dst = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        dstOpnd_00 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        src1 = &dst_00->super_Opnd;
        pOVar5 = srcs[0];
        if (ordLanes == (uint8  [4])0x3) {
          src1 = srcs[0];
          pOVar5 = &dst_00->super_Opnd;
        }
        if (dst_00 == (RegOpnd *)srcs[0]) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                              ,0x66a,"(majSrc != minSrc)","majSrc != minSrc");
          if (!bVar19) goto LAB_00671924;
          *puVar12 = 0;
        }
        lVar18 = 0;
        do {
          if (((byte)(((RegOpnd *)src1 != dst_00) << 2) <= local_34[lVar18]) &&
             (local_34[lVar18] < (byte)(((RegOpnd *)src1 != dst_00) * '\x04' + 4U)))
          goto LAB_006716e4;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        lVar18 = 0;
LAB_006716e4:
        pMemLoc = ThreadContextInfo::GetX86FourLanesMaskAddr
                            (this->m_func->m_threadContextInfo,(uint8)lVar18);
        src1Opnd = IR::MemRefOpnd::New(pMemLoc,dstOpnd->m_type,this->m_func,AddrOpndKindDynamicMisc)
        ;
        instr_00 = _lanesSrc;
        InsertShufps(this,local_34,&pRVar13->super_Opnd,pOVar5,pOVar5,_lanesSrc);
        InsertShufps(this,local_34,&dst->super_Opnd,src1,src1,instr_00);
        pIVar14 = IR::Instr::New(MOVUPS,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar14);
        Legalize<false>(pIVar14,false);
        pIVar14 = IR::Instr::New(ANDPS,&dst->super_Opnd,&dst->super_Opnd,&dstOpnd_00->super_Opnd,
                                 this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar14);
        Legalize<false>(pIVar14,false);
        pIVar14 = IR::Instr::New(ANDNPS,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,
                                 &pRVar13->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar14);
        Legalize<false>(pIVar14,false);
        pIVar14 = IR::Instr::New(ORPS,dstOpnd,&dst->super_Opnd,&dstOpnd_00->super_Opnd,this->m_func)
        ;
        IR::Instr::InsertBefore(instr_00,pIVar14);
        Legalize<false>(pIVar14,false);
      }
      goto LAB_0067152f;
    }
    if ((local_34[0] < 4) && (local_34[1] < 4)) {
      if ((local_34[2] < 4) || (local_34[3] < 4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar19 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                            ,0x63f,"(lanes[2] >= 4 && lanes[3] >= 4)",
                            "lanes[2] >= 4 && lanes[3] >= 4");
        if (!bVar19) goto LAB_00671924;
        *puVar12 = 0;
      }
      lanes_00 = local_34;
      pRVar13 = (RegOpnd *)srcs[0];
    }
    else {
      bVar15 = 2;
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar18 = 0;
      bVar16 = 0;
      do {
        if (bVar16 < 4 && local_68[lVar18] == '\x01') {
          local_54[bVar16] = local_34[lVar18];
          local_50[lVar18] = bVar16;
          bVar16 = bVar16 + 1;
        }
        else if (bVar15 < 4) {
          if (local_68[lVar18] != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar19 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                                ,0x653,"(lanesSrc[i] == 2)","lanesSrc[i] == 2");
            if (!bVar19) goto LAB_00671924;
            *puVar12 = 0;
          }
          local_54[bVar15] = local_34[lVar18];
          local_50[lVar18] = bVar15;
          bVar15 = bVar15 + 1;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      dst_00 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
      instr_00 = _lanesSrc;
      InsertShufps(this,local_54,&dst_00->super_Opnd,srcs[5],srcs[0],_lanesSrc);
      lanes_00 = local_50;
      pRVar13 = dst_00;
    }
  }
  InsertShufps(this,lanes_00,dstOpnd,&dst_00->super_Opnd,&pRVar13->super_Opnd,instr_00);
LAB_0067152f:
  IR::Instr::Remove(instr_00);
  return pIVar3;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerShuffle_4(IR::Instr* instr)
{
    Js::OpCode irOpcode = instr->m_opcode;
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *srcs[6] = { nullptr, nullptr, nullptr, nullptr, nullptr, nullptr };

    int j = 0;
    while (!args->Empty() && j < 6)
    {
        srcs[j++] = args->Pop();
    }

    uint8 lanes[4], lanesSrc[4];
    uint fromSrc1, fromSrc2;
    IR::Instr *pInstr = instr->m_prev;

    Assert(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128());
    Assert(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4);

    // globOpt will type-spec if all lane indices are constants, and within range constraints to match a single SSE instruction
    AssertMsg(srcs[2] && srcs[2]->IsIntConstOpnd() &&
              srcs[3] && srcs[3]->IsIntConstOpnd() &&
              srcs[4] && srcs[4]->IsIntConstOpnd() &&
              srcs[5] && srcs[5]->IsIntConstOpnd(), "Type-specialized shuffle is supported only with constant lane indices");

    lanes[0] = (uint8) srcs[2]->AsIntConstOpnd()->AsInt32();
    lanes[1] = (uint8) srcs[3]->AsIntConstOpnd()->AsInt32();
    lanes[2] = (uint8) srcs[4]->AsIntConstOpnd()->AsInt32();
    lanes[3] = (uint8) srcs[5]->AsIntConstOpnd()->AsInt32();
    Assert(lanes[0] >= 0 && lanes[0] < 8);
    Assert(lanes[1] >= 0 && lanes[1] < 8);
    Assert(lanes[2] >= 0 && lanes[2] < 8);
    Assert(lanes[3] >= 0 && lanes[3] < 8);

    CheckShuffleLanes_4(lanes, lanesSrc, &fromSrc1, &fromSrc2);
    Assert(fromSrc1 + fromSrc2 == 4);

    if (fromSrc1 == 4 || fromSrc2 == 4)
    {
        // can be done with a swizzle
        IR::Opnd *srcOpnd = fromSrc1 == 4 ? srcs[0] : srcs[1];
        InsertShufps(lanes, dst, srcOpnd, srcOpnd, instr);
    }
    else if (fromSrc1 == 2)
    {
        if (lanes[0] < 4 && lanes[1] < 4)
        {
            // x86 friendly shuffle
            Assert(lanes[2] >= 4 && lanes[3] >= 4);
            InsertShufps(lanes, dst, srcs[0], srcs[1], instr);
        }
        else
        {
            // arbitrary shuffle with 2 lanes from each src
            uint8 ordLanes[4], reArrLanes[4];

            // order lanes based on which src they come from
            // compute re-arrangement mask
            for (uint8 i = 0, j1 = 0, j2 = 2; i < 4; i++)
            {
                if (lanesSrc[i] == 1 && j1 < 4)
                {
                    ordLanes[j1] = lanes[i];
                    reArrLanes[i] = j1;
                    j1++;
                }
                else if(j2 < 4)
                {
                    Assert(lanesSrc[i] == 2);
                    ordLanes[j2] = lanes[i];
                    reArrLanes[i] = j2;
                    j2++;
                }
            }
            IR::RegOpnd *temp = IR::RegOpnd::New(dst->GetType(), m_func);
            InsertShufps(ordLanes, temp, srcs[0], srcs[1], instr);
            InsertShufps(reArrLanes, dst, temp, temp, instr);
        }
    }
    else if (fromSrc1 == 3 || fromSrc2 == 3)
    {
        // shuffle with 3 lanes from one src, one from another

        IR::Instr *newInstr;
        IR::Opnd * majSrc, *minSrc;
        IR::RegOpnd *temp1 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp2 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp3 = IR::RegOpnd::New(dst->GetType(), m_func);
        uint8 minorityLane = 0, maxLaneValue;
        majSrc = fromSrc1 == 3 ? srcs[0] : srcs[1];
        minSrc = fromSrc1 == 3 ? srcs[1] : srcs[0];
        Assert(majSrc != minSrc);

        // Algorithm:
        // SHUFPS temp1, majSrc, lanes
        // SHUFPS temp2, minSrc, lanes
        // MOVUPS temp3, [minorityLane mask]
        // ANDPS  temp2, temp3          // mask all lanes but minorityLane
        // ANDNPS temp3, temp1          // zero minorityLane
        // ORPS   dst, temp2, temp3

        // find minorityLane to mask
        maxLaneValue = minSrc == srcs[0] ? 4 : 8;
        for (uint8 i = 0; i < 4; i++)
        {
            if (lanes[i] >= (maxLaneValue - 4) && lanes[i] < maxLaneValue)
            {
                minorityLane = i;
                break;
            }
        }
        IR::MemRefOpnd * laneMask = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86FourLanesMaskAddr(minorityLane), dst->GetType(), m_func);

        InsertShufps(lanes, temp1, majSrc, majSrc, instr);
        InsertShufps(lanes, temp2, minSrc, minSrc, instr);
        newInstr = IR::Instr::New(Js::OpCode::MOVUPS, temp3, laneMask, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDPS, temp2, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDNPS, temp3, temp3, temp1, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ORPS, dst, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }

    instr->Remove();
    return pInstr;
}